

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void verb_prog_antava_touch_hand(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  char *txt;
  int local_254;
  CHAR_DATA *ch_local;
  void *local_248;
  void *local_240;
  ROOM_INDEX_DATA *tomb;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ch_local = ch;
  tomb = get_room_index(0);
  if (ch->in_room->vnum != 0x1ce) {
    return;
  }
  if (ch->fighting == (CHAR_DATA *)0x0) {
    if (6 < ch->position) {
      act("You touch the hand of the decaying statue.",ch,(void *)0x0,(void *)0x0,3);
      act("$n reaches up and touches the hand of the decaying statue.",ch,(void *)0x0,(void *)0x0,0)
      ;
      act("A rusty clicking noise begins to sound from within the statue.",(CHAR_DATA *)0x0,
          (void *)0x0,(void *)0x0,0);
      if (ch->in_room->vnum != 0x1ce) {
        return;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"verb_prog_antava_touch_hand","");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"act_queue","");
      local_248 = (void *)0x0;
      local_240 = (void *)0x0;
      local_254 = 3;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[84],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,0xe,&local_50,&local_150,act_queue,
                 (char (*) [84])
                 "Darkness closes back in upon the antechamber as the stone above you shuts abruptly!"
                 ,&ch_local,&local_248,&local_240,&local_254);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"verb_prog_antava_touch_hand","");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"do_look_queue","");
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[5]>
                (&RS.Queue,9,&local_70,&local_170,do_look_queue,&ch_local,(char (*) [5])"auto");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"verb_prog_antava_touch_hand","");
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"act_queue","");
      local_248 = (void *)0x0;
      local_240 = (void *)0x0;
      local_254 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[36],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,9,&local_90,&local_190,act_queue,
                 (char (*) [36])"$n suddenly slides down from above!",&ch_local,&local_248,
                 &local_240,&local_254);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"verb_prog_antava_touch_hand","");
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"char_to_room","");
      CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
                (&RS.Queue,9,&local_b0,&local_1b0,char_to_room,&ch_local,&tomb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"verb_prog_antava_touch_hand","");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"char_from_room","");
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,9,&local_d0,&local_1d0,char_from_room,&ch_local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"verb_prog_antava_touch_hand","");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"act_queue","");
      local_248 = (void *)0x0;
      local_240 = (void *)0x0;
      local_254 = 3;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[54],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,9,&local_f0,&local_1f0,act_queue,
                 (char (*) [54])"You suddenly feel the ground drop out from under you!",&ch_local,
                 &local_248,&local_240,&local_254);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"verb_prog_antava_touch_hand","");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"act_queue","");
      local_248 = (void *)0x0;
      local_240 = (void *)0x0;
      local_254 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[79],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,9,&local_110,&local_210,act_queue,
                 (char (*) [79])
                 "The sound of grinding granite fills the air as $n suddenly drops out of sight!",
                 &ch_local,&local_248,&local_240,&local_254);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"verb_prog_antava_touch_hand","");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"WAIT_STATE","");
      local_248 = (void *)CONCAT44(local_248._4_4_,0x3c);
      CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int>
                (&RS.Queue,2,&local_130,&local_230,WAIT_STATE,&ch_local,(int *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p == &local_130.field_2) {
        return;
      }
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      return;
    }
    txt = "You can\'t reach it while you\'re sitting down.\n\r";
  }
  else {
    txt = "You\'re too busy fighting to do that!\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void verb_prog_antava_touch_hand(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *tomb = get_room_index(102);

	if (ch->in_room->vnum != 462)
		return;

	if (ch->fighting)
	{
		send_to_char("You're too busy fighting to do that!\n\r", ch);
		return;
	}

	if (ch->position <= POS_SITTING)
	{
		send_to_char("You can't reach it while you're sitting down.\n\r", ch);
		return;
	}

	act("You touch the hand of the decaying statue.", ch, 0, 0, TO_CHAR);
	act("$n reaches up and touches the hand of the decaying statue.", ch, 0, 0, TO_ROOM);
	act("A rusty clicking noise begins to sound from within the statue.", 0, 0, 0, TO_ROOM);

	if (ch->in_room->vnum != 462)
		return;

	RS.Queue.AddToQueue(14,"verb_prog_antava_touch_hand", "act_queue", act_queue, "Darkness closes back in upon the antechamber as the stone above you shuts abruptly!", ch, nullptr, nullptr, TO_CHAR);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "do_look_queue", do_look_queue, ch, "auto");
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "$n suddenly slides down from above!", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "char_to_room", char_to_room, ch, tomb);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "char_from_room", char_from_room, ch);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "You suddenly feel the ground drop out from under you!", ch, nullptr, nullptr, TO_CHAR);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "The sound of grinding granite fills the air as $n suddenly drops out of sight!", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(2, "verb_prog_antava_touch_hand", "WAIT_STATE", WAIT_STATE, ch, PULSE_VIOLENCE * 5);
}